

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
MCTS::compute_tree<NimState>(TestGame root_state,ComputeOptions options,result_type initial_seed)

{
  bool bVar1;
  runtime_error *this;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  int in_ESI;
  __uniq_ptr_data<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>,_true,_true>
  in_RDI;
  int in_stack_0000000c;
  double in_stack_00000010;
  Move move;
  pointer node;
  int iter;
  TestGame state;
  mt19937_64 random_engine;
  undefined4 in_stack_fffffffffffff588;
  Move in_stack_fffffffffffff58c;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff590;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff598;
  undefined7 in_stack_fffffffffffff5a0;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff5a8;
  Move in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  bool local_a3b;
  Node<NimState> *in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5f0;
  Move MVar2;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar3;
  undefined4 in_stack_fffffffffffff600;
  int iVar4;
  NimState local_9f8 [11];
  undefined1 local_9ed;
  int in_stack_fffffffffffff7e4;
  char *in_stack_fffffffffffff7e8;
  char *in_stack_fffffffffffff7f0;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
            );
  if ((in_stack_0000000c < 0) && (in_stack_00000010 < 0.0)) {
    assertion_failed(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4);
  }
  if (in_stack_00000010 < 0.0) {
    if ((in_ESI != 1) && (in_ESI != 2)) {
      assertion_failed(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e4
                      );
    }
    local_9ed = 0;
    operator_new(0x60);
    Node<NimState>::Node
              ((Node<NimState> *)in_stack_fffffffffffff590,
               (TestGame *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
    std::unique_ptr<MCTS::Node<NimState>,std::default_delete<MCTS::Node<NimState>>>::
    unique_ptr<std::default_delete<MCTS::Node<NimState>>,void>
              ((unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_> *)
               in_stack_fffffffffffff590,
               (pointer)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
    NimState::NimState(local_9f8,0x11);
    for (iVar4 = 1; iVar4 <= in_stack_0000000c || in_stack_0000000c < 0; iVar4 = iVar4 + 1) {
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)std::
                   unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>::
                   get((unique_ptr<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
                        *)in_stack_fffffffffffff590);
      while( true ) {
        bVar1 = Node<NimState>::has_untried_moves((Node<NimState> *)0x1e2b02);
        local_a3b = false;
        if (!bVar1) {
          local_a3b = Node<NimState>::has_children((Node<NimState> *)0x1e2b23);
        }
        if (local_a3b == false) break;
        this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   *)Node<NimState>::select_child_UCT(in_stack_fffffffffffff5d0);
        NimState::do_move((TestGame *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c);
      }
      bVar1 = Node<NimState>::has_untried_moves((Node<NimState> *)0x1e2bc0);
      in_stack_fffffffffffff5b4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff5b4);
      if (bVar1) {
        in_stack_fffffffffffff5b0 =
             Node<NimState>::
             get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                       ((Node<NimState> *)
                        CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                        in_stack_fffffffffffff5a8);
        MVar2 = in_stack_fffffffffffff5b0;
        NimState::do_move((TestGame *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c);
        in_stack_fffffffffffff5a8 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)Node<NimState>::add_child
                          ((Node<NimState> *)CONCAT44(iVar4,in_stack_fffffffffffff600),
                           (Move *)this_00,(TestGame *)CONCAT44(MVar2,in_stack_fffffffffffff5f0));
        this_00 = in_stack_fffffffffffff5a8;
      }
      while (bVar1 = NimState::has_moves((TestGame *)in_stack_fffffffffffff590), bVar1) {
        NimState::
        do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                  ((TestGame *)CONCAT17(bVar1,in_stack_fffffffffffff5a0),in_stack_fffffffffffff598);
      }
      while (this_00 !=
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)0x0) {
        pmVar3 = this_00;
        in_stack_fffffffffffff598 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)NimState::get_result
                          ((TestGame *)in_stack_fffffffffffff598,(int)((ulong)this_00 >> 0x20));
        Node<NimState>::update((Node<NimState> *)this_00,(double)in_stack_fffffffffffff598);
        in_stack_fffffffffffff590 = this_00;
        this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                   *)pmVar3->_M_x[1];
      }
    }
    return (__uniq_ptr_data<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>,_true,_true>
            )(tuple<MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>)
             in_RDI.
             super___uniq_ptr_impl<MCTS::Node<NimState>,_std::default_delete<MCTS::Node<NimState>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_MCTS::Node<NimState>_*,_std::default_delete<MCTS::Node<NimState>_>_>
             .super__Head_base<0UL,_MCTS::Node<NimState>_*,_false>._M_head_impl;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}